

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.h
# Opt level: O3

int32_t floatx80_to_int32_round_to_zero_aarch64(floatx80 a,float_status *status)

{
  ushort uVar1;
  byte bVar2;
  int32_t iVar3;
  ulong uVar4;
  byte bVar5;
  ushort uVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  
  uVar7 = a.low;
  uVar1 = a.high;
  uVar6 = uVar1 & 0x7fff;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 && -1 < (long)uVar7)
  {
    status->float_exception_flags = status->float_exception_flags | 1;
    return -0x80000000;
  }
  bVar2 = a.high._1_1_ >> 7;
  if (uVar6 < 0x401f) {
    if (uVar6 < 0x3fff) {
      iVar3 = 0;
      if (uVar7 == 0 && ((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
        return 0;
      }
    }
    else {
      bVar5 = 0x3e - (char)uVar6;
      uVar9 = uVar7 >> (bVar5 & 0x3f);
      uVar4 = (ulong)(uint)-(int)uVar9;
      if (-1 < (short)uVar1) {
        uVar4 = uVar9 & 0xffffffff;
      }
      iVar3 = (int32_t)uVar4;
      bVar8 = bVar2;
      if ((uint)(uVar4 >> 0x1f) != (uint)(uVar1 >> 0xf)) goto LAB_005e68e3;
      if (uVar9 << (bVar5 & 0x3f) == uVar7) {
        return iVar3;
      }
    }
    status->float_exception_flags = status->float_exception_flags | 0x20;
    return iVar3;
  }
  bVar8 = 0;
  if (uVar6 != 0x7fff) {
    bVar8 = a.high._1_1_ >> 7;
  }
  if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) {
    bVar8 = bVar2;
  }
LAB_005e68e3:
  status->float_exception_flags = status->float_exception_flags | 1;
  return -0x80000000 - (uint)(bVar8 == 0);
}

Assistant:

static inline bool floatx80_invalid_encoding(floatx80 a)
{
    return (a.low & (1ULL << 63)) == 0 && (a.high & 0x7FFF) != 0;
}